

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::readToken(Reader *this,Token *token)

{
  Char CVar1;
  bool local_1a;
  bool ok;
  Char c;
  Token *token_local;
  Reader *this_local;
  
  skipSpaces(this);
  token->start_ = this->current_;
  CVar1 = getNextChar(this);
  local_1a = true;
  switch(CVar1) {
  case '\0':
    token->type_ = tokenEndOfStream;
    break;
  default:
    local_1a = false;
    break;
  case '\"':
    token->type_ = tokenString;
    local_1a = readString(this);
    break;
  case ',':
    token->type_ = tokenArraySeparator;
    break;
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    token->type_ = tokenNumber;
    readNumber(this);
    break;
  case '/':
    token->type_ = tokenComment;
    local_1a = readComment(this);
    break;
  case ':':
    token->type_ = tokenMemberSeparator;
    break;
  case '[':
    token->type_ = tokenArrayBegin;
    break;
  case ']':
    token->type_ = tokenArrayEnd;
    break;
  case 'f':
    token->type_ = tokenFalse;
    local_1a = match(this,"alse",4);
    break;
  case 'n':
    token->type_ = tokenNull;
    local_1a = match(this,"ull",3);
    break;
  case 't':
    token->type_ = tokenTrue;
    local_1a = match(this,"rue",3);
    break;
  case '{':
    token->type_ = tokenObjectBegin;
    break;
  case '}':
    token->type_ = tokenObjectEnd;
  }
  if (local_1a == false) {
    token->type_ = tokenError;
  }
  token->end_ = this->current_;
  return local_1a;
}

Assistant:

bool Reader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case '-':
    token.type_ = tokenNumber;
    readNumber();
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return ok;
}